

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O0

int beagleGetSiteDerivatives(int instance,double *outFirstDerivatives,double *outSecondDerivatives)

{
  BeagleImpl *pBVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  int returnValue;
  BeagleImpl *beagleInstance;
  int in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  pBVar1 = beagle::getBeagleInstance(in_stack_ffffffffffffffdc);
  if (pBVar1 == (BeagleImpl *)0x0) {
    local_4 = -4;
  }
  else {
    local_4 = (**(code **)(*(long *)pBVar1 + 0x188))(pBVar1,in_RSI,in_RDX);
  }
  return local_4;
}

Assistant:

int beagleGetSiteDerivatives(int instance,
                             double* outFirstDerivatives,
                             double* outSecondDerivatives) {
    DEBUG_START_TIME();
    beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
    if (beagleInstance == NULL)
        return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
    int returnValue = beagleInstance->getSiteDerivatives(outFirstDerivatives, outSecondDerivatives);
    DEBUG_END_TIME();

#ifdef BEAGLE_DEBUG_FP_REDUCED_PRECISION
        union {double f; long l;} dfp;
        for(int i=0; i < debugPatternCount; i++) {
            dfp.f = outFirstDerivatives[i];
            dfp.l = dfp.l & FP_REDUCED_PRECISION_MASK;
            outFirstDerivatives[i] = dfp.f;
            dfp.f = outSecondDerivatives[i];
            dfp.l = dfp.l & FP_REDUCED_PRECISION_MASK;
            outSecondDerivatives[i] = dfp.f;
        }
#endif

    return returnValue;
}